

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match.c
# Opt level: O3

_Bool av1_compute_global_motion_feature_match
                (TransformationType type,YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *ref,
                int bit_depth,int downsample_level,MotionModel *motion_models,int num_motion_models,
                _Bool *mem_alloc_failed)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ImagePyramid *pyr;
  CornerList *corners;
  ImagePyramid *pyr_00;
  CornerList *corners_00;
  PyramidLayer *pPVar5;
  uchar *puVar6;
  uchar *puVar7;
  _Bool _Var8;
  int iVar9;
  Correspondence *matched_points;
  void *memblk;
  void *memblk_00;
  int iVar10;
  int j;
  int iVar11;
  double *pdVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  size_t sVar18;
  ulong uVar19;
  double dVar20;
  ulong local_a8;
  double local_50;
  double u;
  double *local_40;
  MotionModel *local_38;
  
  pyr = src->y_pyramid;
  corners = src->corners;
  pyr_00 = ref->y_pyramid;
  corners_00 = ref->corners;
  local_38 = motion_models;
  iVar9 = aom_compute_pyramid(src,bit_depth,1,pyr);
  if ((((iVar9 < 0) ||
       (_Var8 = av1_compute_corner_list(src,bit_depth,downsample_level,corners), !_Var8)) ||
      (iVar9 = aom_compute_pyramid(ref,bit_depth,1,pyr_00), iVar9 < 0)) ||
     (_Var8 = av1_compute_corner_list(src,bit_depth,downsample_level,corners_00), !_Var8)) {
    *mem_alloc_failed = true;
  }
  else {
    pPVar5 = pyr->layers;
    puVar6 = pPVar5->buffer;
    iVar9 = pPVar5->width;
    iVar2 = pPVar5->height;
    iVar3 = pPVar5->stride;
    pPVar5 = pyr_00->layers;
    puVar7 = pPVar5->buffer;
    iVar10 = pPVar5->stride;
    matched_points = (Correspondence *)aom_malloc((long)corners->num_corners << 5);
    if (matched_points != (Correspondence *)0x0) {
      iVar11 = corners->num_corners;
      iVar13 = corners_00->num_corners;
      memblk = aom_calloc((long)iVar11,0x28);
      if (memblk == (void *)0x0) {
        iVar10 = 0;
        memblk_00 = (void *)0x0;
      }
      else {
        memblk_00 = aom_calloc((long)iVar13,0x28);
        if (memblk_00 == (void *)0x0) {
          memblk_00 = (void *)0x0;
        }
        else if (0 < iVar11) {
          sVar18 = 0;
          uVar16 = 0;
          do {
            iVar14 = corners->corners[sVar18 * 2];
            if (((6 < iVar14) && (iVar4 = corners->corners[sVar18 * 2 + 1], 6 < iVar4)) &&
               ((iVar14 + 7 < iVar9 && (iVar4 + 7 < iVar2)))) {
              lVar17 = (long)(int)uVar16;
              *(int *)((long)memblk + lVar17 * 0x28) = iVar14;
              *(int *)((long)memblk + lVar17 * 0x28 + 4) = iVar4;
              *(undefined8 *)((long)memblk + lVar17 * 0x28 + 0x20) = 0x3fe8000000000000;
              _Var8 = (*aom_compute_mean_stddev)
                                (puVar6,iVar3,iVar14,iVar4,
                                 (double *)((long)memblk + lVar17 * 0x28 + 8),
                                 (double *)((long)memblk + lVar17 * 0x28 + 0x10));
              uVar16 = uVar16 + _Var8;
            }
            sVar18 = sVar18 + 1;
          } while ((long)iVar11 != sVar18);
          if ((0 < iVar13) && (uVar16 != 0)) {
            sVar18 = 0;
            local_a8 = 0;
            do {
              iVar11 = corners_00->corners[sVar18 * 2];
              if ((((6 < iVar11) && (iVar14 = corners_00->corners[sVar18 * 2 + 1], 6 < iVar14)) &&
                  (iVar11 + 7 < iVar9)) && (iVar14 + 7 < iVar2)) {
                lVar17 = (long)(int)local_a8;
                *(int *)((long)memblk_00 + lVar17 * 0x28) = iVar11;
                *(int *)((long)memblk_00 + lVar17 * 0x28 + 4) = iVar14;
                *(undefined8 *)((long)memblk_00 + lVar17 * 0x28 + 0x20) = 0x3fe8000000000000;
                _Var8 = (*aom_compute_mean_stddev)
                                  (puVar7,iVar10,iVar11,iVar14,
                                   (double *)((long)memblk_00 + lVar17 * 0x28 + 8),
                                   (double *)((long)memblk_00 + lVar17 * 0x28 + 0x10));
                local_a8 = (ulong)((int)local_a8 + (uint)_Var8);
              }
              sVar18 = sVar18 + 1;
            } while ((long)iVar13 != sVar18);
            if (((int)local_a8 != 0) && (0 < (int)uVar16)) {
              iVar11 = iVar2;
              if (iVar2 < iVar9) {
                iVar11 = iVar9;
              }
              local_40 = (double *)((long)memblk_00 + 0x20);
              uVar19 = 0;
              do {
                if (0 < (int)local_a8) {
                  piVar1 = (int *)((long)memblk + uVar19 * 0x28);
                  uVar15 = 0;
                  pdVar12 = local_40;
                  do {
                    iVar13 = *piVar1 - *(int *)(pdVar12 + -4);
                    iVar14 = piVar1[1] - *(int *)((long)pdVar12 + -0x1c);
                    if ((uint)(iVar14 * iVar14 + iVar13 * iVar13) <=
                        (uint)((iVar11 >> 4) * (iVar11 >> 4))) {
                      dVar20 = (*aom_compute_correlation)
                                         (puVar6,iVar3,*piVar1,piVar1[1],*(double *)(piVar1 + 2),
                                          *(double *)(piVar1 + 4),puVar7,iVar10,
                                          *(int *)(pdVar12 + -4),*(int *)((long)pdVar12 + -0x1c),
                                          pdVar12[-3],pdVar12[-2]);
                      if (*(double *)(piVar1 + 8) <= dVar20 && dVar20 != *(double *)(piVar1 + 8)) {
                        piVar1[6] = (int)uVar15;
                        *(double *)(piVar1 + 8) = dVar20;
                      }
                      if (*pdVar12 <= dVar20 && dVar20 != *pdVar12) {
                        *(int *)(pdVar12 + -1) = (int)uVar19;
                        *pdVar12 = dVar20;
                      }
                    }
                    uVar15 = uVar15 + 1;
                    pdVar12 = pdVar12 + 5;
                  } while (local_a8 != uVar15);
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 != uVar16);
              pdVar12 = (double *)((long)memblk + 0x20);
              uVar19 = 0;
              iVar10 = 0;
              do {
                if ((0.75 < *pdVar12 || *pdVar12 == 0.75) &&
                   (uVar19 == *(uint *)((long)memblk_00 + (long)*(int *)(pdVar12 + -1) * 0x28 + 0x18
                                       ))) {
                  piVar1 = (int *)((long)memblk_00 + (long)*(int *)(pdVar12 + -1) * 0x28);
                  iVar11 = *(int *)(pdVar12 + -4);
                  iVar13 = *(int *)((long)pdVar12 + -0x1c);
                  u = (double)(*piVar1 - iVar11);
                  local_50 = (double)(piVar1[1] - iVar13);
                  (*aom_compute_flow_at_point)
                            (puVar6,puVar7,iVar11 + -3,iVar13 + -3,iVar9,iVar2,iVar3,&u,&local_50);
                  matched_points[iVar10].x = (double)iVar11;
                  matched_points[iVar10].y = (double)iVar13;
                  matched_points[iVar10].rx = (double)iVar11 + u;
                  matched_points[iVar10].ry = (double)iVar13 + local_50;
                  iVar10 = iVar10 + 1;
                }
                uVar19 = uVar19 + 1;
                pdVar12 = pdVar12 + 5;
              } while (uVar16 != uVar19);
              goto LAB_0029ce37;
            }
          }
          iVar10 = 0;
          goto LAB_0029ce37;
        }
        iVar10 = 0;
      }
LAB_0029ce37:
      aom_free(memblk);
      aom_free(memblk_00);
      _Var8 = ransac(matched_points,iVar10,type,local_38,num_motion_models,mem_alloc_failed);
      aom_free(matched_points);
      return _Var8;
    }
    *mem_alloc_failed = true;
  }
  return false;
}

Assistant:

bool av1_compute_global_motion_feature_match(
    TransformationType type, YV12_BUFFER_CONFIG *src, YV12_BUFFER_CONFIG *ref,
    int bit_depth, int downsample_level, MotionModel *motion_models,
    int num_motion_models, bool *mem_alloc_failed) {
  int num_correspondences;
  Correspondence *correspondences;
  ImagePyramid *src_pyramid = src->y_pyramid;
  CornerList *src_corners = src->corners;
  ImagePyramid *ref_pyramid = ref->y_pyramid;
  CornerList *ref_corners = ref->corners;

  // Precompute information we will need about each frame
  if (aom_compute_pyramid(src, bit_depth, 1, src_pyramid) < 0) {
    *mem_alloc_failed = true;
    return false;
  }
  if (!av1_compute_corner_list(src, bit_depth, downsample_level, src_corners)) {
    *mem_alloc_failed = true;
    return false;
  }
  if (aom_compute_pyramid(ref, bit_depth, 1, ref_pyramid) < 0) {
    *mem_alloc_failed = true;
    return false;
  }
  if (!av1_compute_corner_list(src, bit_depth, downsample_level, ref_corners)) {
    *mem_alloc_failed = true;
    return false;
  }

  const uint8_t *src_buffer = src_pyramid->layers[0].buffer;
  const int src_width = src_pyramid->layers[0].width;
  const int src_height = src_pyramid->layers[0].height;
  const int src_stride = src_pyramid->layers[0].stride;

  const uint8_t *ref_buffer = ref_pyramid->layers[0].buffer;
  assert(ref_pyramid->layers[0].width == src_width);
  assert(ref_pyramid->layers[0].height == src_height);
  const int ref_stride = ref_pyramid->layers[0].stride;

  // find correspondences between the two images
  correspondences = (Correspondence *)aom_malloc(src_corners->num_corners *
                                                 sizeof(*correspondences));
  if (!correspondences) {
    *mem_alloc_failed = true;
    return false;
  }
  num_correspondences = determine_correspondence(
      src_buffer, src_corners->corners, src_corners->num_corners, ref_buffer,
      ref_corners->corners, ref_corners->num_corners, src_width, src_height,
      src_stride, ref_stride, correspondences);

  bool result = ransac(correspondences, num_correspondences, type,
                       motion_models, num_motion_models, mem_alloc_failed);

  aom_free(correspondences);
  return result;
}